

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int fd;
  int use_fd;
  int close_fd;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  
  if ((*(uint *)(in_RDI + 0x28) & 8) != 0) {
    setsid();
  }
  local_28 = 0;
  do {
    if (in_ESI <= local_28) {
      if ((*(long *)(in_RDI + 0x20) != 0) && (iVar1 = chdir(*(char **)(in_RDI + 0x20)), iVar1 != 0))
      {
        __errno_location();
        uv__write_int(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        perror("chdir()");
        _exit(0x7f);
      }
      if (((*(uint *)(in_RDI + 0x28) & 2) != 0) &&
         (iVar1 = setgid(*(__gid_t *)(in_RDI + 0x3c)), iVar1 != 0)) {
        __errno_location();
        uv__write_int(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        perror("setgid()");
        _exit(0x7f);
      }
      if (((*(uint *)(in_RDI + 0x28) & 1) != 0) &&
         (iVar1 = setuid(*(__uid_t *)(in_RDI + 0x38)), iVar1 != 0)) {
        __errno_location();
        uv__write_int(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        perror("setuid()");
        _exit(0x7f);
      }
      if (*(long *)(in_RDI + 0x18) != 0) {
        _environ = *(undefined8 *)(in_RDI + 0x18);
      }
      execvp(*(char **)(in_RDI + 8),*(char ***)(in_RDI + 0x10));
      __errno_location();
      uv__write_int(in_ECX,in_stack_ffffffffffffffc0);
      perror("execvp()");
      _exit(0x7f);
    }
    local_24 = *(int *)(in_RDX + 4 + (long)local_28 * 8);
    if (local_24 < 0) {
      if (local_28 < 3) {
        iVar1 = 2;
        if (local_28 == 0) {
          iVar1 = 0;
        }
        local_24 = open("/dev/null",iVar1);
        if (local_24 == -1) {
          __errno_location();
          uv__write_int(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
          perror("failed to open stdio");
          _exit(0x7f);
        }
        goto LAB_001137e7;
      }
    }
    else {
      if (*(int *)(in_RDX + (long)local_28 * 8) != -1) {
        uv__close(in_stack_ffffffffffffffc4);
      }
LAB_001137e7:
      if (local_28 == local_24) {
        uv__cloexec(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
      else {
        dup2(local_24,local_28);
        uv__close(in_stack_ffffffffffffffc4);
      }
      if (local_28 < 3) {
        uv__nonblock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  int close_fd;
  int use_fd;
  int fd;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd >= 0) {
      if (close_fd != -1)
        uv__close(close_fd);
    }
    else if (fd >= 3)
      continue;
    else {
      /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
       * set
       */
      use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);

      if (use_fd == -1) {
        uv__write_int(error_fd, -errno);
        perror("failed to open stdio");
        _exit(127);
      }
    }

    if (fd == use_fd)
      uv__cloexec(use_fd, 0);
    else {
      dup2(use_fd, fd);
      uv__close(use_fd);
    }

    if (fd <= 2)
      uv__nonblock(fd, 0);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, -errno);
    perror("chdir()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, -errno);
    perror("setgid()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, -errno);
    perror("setuid()");
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, -errno);
  perror("execvp()");
  _exit(127);
}